

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureFilterMinmaxParameterQueriesTestCase::testReductionModeQueriesDefaultValues
          (TextureFilterMinmaxParameterQueriesTestCase *this,Functions *gl)

{
  glGetSamplerParameterivFunc p_Var1;
  SupportedTextureType *this_00;
  glGetTexParameterivFunc p_Var2;
  glGetTexParameterIivFunc p_Var3;
  glGetTextureParameterivFunc p_Var4;
  glGetTextureParameterIivFunc p_Var5;
  undefined8 context;
  bool bVar6;
  GLenum GVar7;
  deUint32 dVar8;
  deBool dVar9;
  TypedObjectWrapper<(glu::ObjectType)7> *this_01;
  ObjectWrapper *this_02;
  TestError *pTVar10;
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
  *pvVar11;
  reference ppSVar12;
  ContextInfo *this_03;
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
  *pvVar13;
  pointer pSVar14;
  Texture2D *pTVar15;
  DefaultDeleter<glu::Texture2D> local_89;
  undefined1 local_88 [8];
  MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> texture;
  __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
  local_70;
  SupportedTextureDataTypeIter iter_1;
  bool is_arb_es31_compatibility;
  SupportedTextureType *textureType;
  __normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*const_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>_>
  local_50;
  SupportedTextureTypeIter iter;
  DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_> local_3d;
  GLint params;
  undefined1 local_30 [8];
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  sampler;
  RenderContext *renderContext;
  Functions *gl_local;
  TextureFilterMinmaxParameterQueriesTestCase *this_local;
  
  sampler.
  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  .m_data._8_8_ = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  this_01 = (TypedObjectWrapper<(glu::ObjectType)7> *)operator_new(0x18);
  glu::TypedObjectWrapper<(glu::ObjectType)7>::TypedObjectWrapper
            (this_01,(RenderContext *)
                     sampler.
                     super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
                     .m_data._8_8_);
  de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>::DefaultDeleter(&local_3d);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  ::MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
             *)local_30,this_01);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"glu::Sampler error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x21d);
  p_Var1 = gl->getSamplerParameteriv;
  this_02 = &de::details::
             UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
             ::operator*((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
                          *)local_30)->super_ObjectWrapper;
  dVar8 = glu::ObjectWrapper::operator*(this_02);
  (*p_Var1)(dVar8,0x9366,(GLint *)((long)&iter._M_current + 4));
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"getSamplerParameteriv error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x222);
  do {
    dVar9 = ::deGetFalse();
    if ((dVar9 != 0) || (iter._M_current._4_4_ != 0x9367)) {
      pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar10,"getSamplerParameteriv value mismatch with expected default",
                 "params == GL_WEIGHTED_AVERAGE_ARB",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                 ,0x223);
      __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    dVar9 = ::deGetFalse();
  } while (dVar9 != 0);
  pvVar11 = TextureFilterMinmaxUtils::getSupportedTextureTypes(&this->m_utils);
  local_50._M_current =
       (SupportedTextureType **)
       std::
       vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
       ::begin(pvVar11);
  do {
    pvVar11 = TextureFilterMinmaxUtils::getSupportedTextureTypes(&this->m_utils);
    textureType = (SupportedTextureType *)
                  std::
                  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
                  ::end(pvVar11);
    bVar6 = __gnu_cxx::operator!=
                      (&local_50,
                       (__normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*const_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>_>
                        *)&textureType);
    if (!bVar6) {
      this_03 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
      iter_1._M_current._7_1_ =
           glu::ContextInfo::isExtensionSupported(this_03,"GL_ARB_ES3_1_compatibility");
      pvVar13 = TextureFilterMinmaxUtils::getSupportedTextureDataTypes(&this->m_utils);
      local_70._M_current =
           (SupportedTextureDataType *)
           std::
           vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
           ::begin(pvVar13);
      do {
        pvVar13 = TextureFilterMinmaxUtils::getSupportedTextureDataTypes(&this->m_utils);
        texture.super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data._8_8_ =
             std::
             vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
             ::end(pvVar13);
        bVar6 = __gnu_cxx::operator!=
                          (&local_70,
                           (__normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
                            *)&texture.
                               super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>
                               .m_data.field_0x8);
        if (!bVar6) {
          de::details::
          MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
          ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
                      *)local_30);
          return;
        }
        pSVar14 = __gnu_cxx::
                  __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
                  ::operator->(&local_70);
        bVar6 = TextureFilterMinmaxUtils::SupportedTextureDataType::hasFlag(pSVar14,COMPATIBILITY);
        if ((!bVar6) || ((iter_1._M_current._7_1_ & 1) != 0)) {
          pTVar15 = (Texture2D *)operator_new(0x70);
          context = sampler.
                    super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
                    .m_data._8_8_;
          pSVar14 = __gnu_cxx::
                    __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
                    ::operator->(&local_70);
          dVar8 = pSVar14->m_format;
          pSVar14 = __gnu_cxx::
                    __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
                    ::operator->(&local_70);
          glu::Texture2D::Texture2D
                    (pTVar15,(RenderContext *)context,dVar8,pSVar14->m_type,0x20,0x20);
          de::DefaultDeleter<glu::Texture2D>::DefaultDeleter(&local_89);
          de::details::MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::MovePtr
                    ((MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> *)local_88,
                     pTVar15);
          pTVar15 = de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::
                    operator->((UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> *)
                               local_88);
          (*pTVar15->_vptr_Texture2D[2])();
          GVar7 = (*gl->getError)();
          glu::checkError(GVar7,"glu::Texture2D error occurred",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                          ,0x23e);
          p_Var4 = gl->getTextureParameteriv;
          pTVar15 = de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::
                    operator->((UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> *)
                               local_88);
          dVar8 = glu::Texture2D::getGLTexture(pTVar15);
          (*p_Var4)(dVar8,0x9366,(GLint *)((long)&iter._M_current + 4));
          GVar7 = (*gl->getError)();
          glu::checkError(GVar7,"getTextureParameteriv error occurred",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                          ,0x241);
          do {
            dVar9 = ::deGetFalse();
            if ((dVar9 != 0) || (iter._M_current._4_4_ != 0x9367)) {
              pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar10,"getTextureParameteriv value mismatch with expected default",
                         "params == GL_WEIGHTED_AVERAGE_ARB",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                         ,0x242);
              __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
            dVar9 = ::deGetFalse();
          } while (dVar9 != 0);
          p_Var5 = gl->getTextureParameterIiv;
          pTVar15 = de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::
                    operator->((UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> *)
                               local_88);
          dVar8 = glu::Texture2D::getGLTexture(pTVar15);
          (*p_Var5)(dVar8,0x9366,(GLint *)((long)&iter._M_current + 4));
          GVar7 = (*gl->getError)();
          glu::checkError(GVar7,"getTextureParameterIiv error occurred",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                          ,0x245);
          do {
            dVar9 = ::deGetFalse();
            if ((dVar9 != 0) || (iter._M_current._4_4_ != 0x9367)) {
              pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar10,"getTextureParameterIiv value mismatch with expected default",
                         "params == GL_WEIGHTED_AVERAGE_ARB",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                         ,0x246);
              __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
            dVar9 = ::deGetFalse();
          } while (dVar9 != 0);
          de::details::MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::~MovePtr
                    ((MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> *)local_88);
        }
        __gnu_cxx::
        __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
        ::operator++(&local_70);
      } while( true );
    }
    ppSVar12 = __gnu_cxx::
               __normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*const_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>_>
               ::operator*(&local_50);
    this_00 = *ppSVar12;
    p_Var2 = gl->getTexParameteriv;
    GVar7 = TextureFilterMinmaxUtils::SupportedTextureType::getType(this_00);
    (*p_Var2)(GVar7,0x9366,(GLint *)((long)&iter._M_current + 4));
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"getTexParameteriv error occurred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                    ,0x22b);
    do {
      dVar9 = ::deGetFalse();
      if ((dVar9 != 0) || (iter._M_current._4_4_ != 0x9367)) {
        pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar10,"getTexParameteriv value mismatch with expected default",
                   "params == GL_WEIGHTED_AVERAGE_ARB",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                   ,0x22c);
        __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar9 = ::deGetFalse();
    } while (dVar9 != 0);
    p_Var3 = gl->getTexParameterIiv;
    GVar7 = TextureFilterMinmaxUtils::SupportedTextureType::getType(this_00);
    (*p_Var3)(GVar7,0x9366,(GLint *)((long)&iter._M_current + 4));
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"getTexParameterIiv error occurred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                    ,0x22f);
    do {
      dVar9 = ::deGetFalse();
      if ((dVar9 != 0) || (iter._M_current._4_4_ != 0x9367)) {
        pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar10,"getTexParameterIiv value mismatch with expected default",
                   "params == GL_WEIGHTED_AVERAGE_ARB",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                   ,0x230);
        __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar9 = ::deGetFalse();
    } while (dVar9 != 0);
    __gnu_cxx::
    __normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*const_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>_>
    ::operator++(&local_50);
  } while( true );
}

Assistant:

void TextureFilterMinmaxParameterQueriesTestCase::testReductionModeQueriesDefaultValues(const glw::Functions& gl)
{
	const glu::RenderContext& renderContext = m_context.getRenderContext();
	de::MovePtr<glu::Sampler> sampler		= de::MovePtr<glu::Sampler>(new glu::Sampler(renderContext));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Sampler error occurred");

	glw::GLint params;

	gl.getSamplerParameteriv(**sampler, GL_TEXTURE_REDUCTION_MODE_ARB, &params);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getSamplerParameteriv error occurred");
	TCU_CHECK_MSG(params == GL_WEIGHTED_AVERAGE_ARB, "getSamplerParameteriv value mismatch with expected default");

	for (TextureFilterMinmaxUtils::SupportedTextureTypeIter iter = m_utils.getSupportedTextureTypes().begin();
		 iter != m_utils.getSupportedTextureTypes().end(); ++iter)
	{
		TextureFilterMinmaxUtils::SupportedTextureType* textureType = *iter;

		gl.getTexParameteriv(textureType->getType(), GL_TEXTURE_REDUCTION_MODE_ARB, &params);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getTexParameteriv error occurred");
		TCU_CHECK_MSG(params == GL_WEIGHTED_AVERAGE_ARB, "getTexParameteriv value mismatch with expected default");

		gl.getTexParameterIiv(textureType->getType(), GL_TEXTURE_REDUCTION_MODE_ARB, &params);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getTexParameterIiv error occurred");
		TCU_CHECK_MSG(params == GL_WEIGHTED_AVERAGE_ARB, "getTexParameterIiv value mismatch with expected default");
	}

	bool is_arb_es31_compatibility = m_context.getContextInfo().isExtensionSupported("GL_ARB_ES3_1_compatibility");

	for (TextureFilterMinmaxUtils::SupportedTextureDataTypeIter iter = m_utils.getSupportedTextureDataTypes().begin();
		 iter != m_utils.getSupportedTextureDataTypes().end(); ++iter)
	{
		if (iter->hasFlag(TextureFilterMinmaxUtils::COMPATIBILITY) && !is_arb_es31_compatibility)
			continue;

		de::MovePtr<glu::Texture2D> texture = de::MovePtr<glu::Texture2D>(new glu::Texture2D(
			renderContext, iter->m_format, iter->m_type, TEXTURE_FILTER_MINMAX_SIZE, TEXTURE_FILTER_MINMAX_SIZE));
		texture->upload();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture2D error occurred");

		gl.getTextureParameteriv(texture->getGLTexture(), GL_TEXTURE_REDUCTION_MODE_ARB, &params);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getTextureParameteriv error occurred");
		TCU_CHECK_MSG(params == GL_WEIGHTED_AVERAGE_ARB, "getTextureParameteriv value mismatch with expected default");

		gl.getTextureParameterIiv(texture->getGLTexture(), GL_TEXTURE_REDUCTION_MODE_ARB, &params);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getTextureParameterIiv error occurred");
		TCU_CHECK_MSG(params == GL_WEIGHTED_AVERAGE_ARB, "getTextureParameterIiv value mismatch with expected default");
	}
}